

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000169620 = 0x2e2e2e2e2e2e2e;
    uRam0000000000169627 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00169610 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000169618 = 0x2e2e2e2e2e2e2e;
    DAT_0016961f = 0x2e;
    _DAT_00169600 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000169608 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001695f0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001695f8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001695e8 = 0x2e2e2e2e2e2e2e2e;
    DAT_0016962f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }